

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O2

void __thiscall cmGlobalNinjaGenerator::AddMacOSXContentRule(cmGlobalNinjaGenerator *this)

{
  cmLocalGenerator *pcVar1;
  string *source;
  ostream *poVar2;
  allocator aStack_2c8;
  allocator local_2c7;
  allocator local_2c6;
  allocator local_2c5;
  allocator local_2c4;
  allocator local_2c3;
  allocator local_2c2;
  allocator local_2c1;
  string local_2c0;
  string local_2a0;
  string local_280;
  string local_260;
  string local_240;
  string local_220;
  string local_200;
  string local_1e0;
  string local_1c0;
  ostringstream cmd;
  
  pcVar1 = *(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.LocalGenerators.
            super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmd);
  source = cmSystemTools::GetCMakeCommand_abi_cxx11_();
  cmOutputConverter::ConvertToOutputFormat(&local_2c0,&pcVar1->super_cmOutputConverter,source,SHELL)
  ;
  poVar2 = std::operator<<((ostream *)&cmd,(string *)&local_2c0);
  std::operator<<(poVar2," -E copy $in $out");
  std::__cxx11::string::~string((string *)&local_2c0);
  std::__cxx11::string::string((string *)&local_2c0,"COPY_OSX_CONTENT",&local_2c1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::string((string *)&local_260,"Copying OS X Content $out",&local_2c2);
  std::__cxx11::string::string
            ((string *)&local_280,"Rule for copying OS X bundle content file.",&local_2c3);
  std::__cxx11::string::string((string *)&local_2a0,"",&local_2c4);
  std::__cxx11::string::string((string *)&local_1c0,"",&local_2c5);
  std::__cxx11::string::string((string *)&local_1e0,"",&local_2c6);
  std::__cxx11::string::string((string *)&local_200,"",&local_2c7);
  std::__cxx11::string::string((string *)&local_220,"",&aStack_2c8);
  AddRule(this,&local_2c0,&local_240,&local_260,&local_280,&local_2a0,&local_1c0,&local_1e0,
          &local_200,&local_220,false);
  std::__cxx11::string::~string((string *)&local_220);
  std::__cxx11::string::~string((string *)&local_200);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::__cxx11::string::~string((string *)&local_280);
  std::__cxx11::string::~string((string *)&local_260);
  std::__cxx11::string::~string((string *)&local_240);
  std::__cxx11::string::~string((string *)&local_2c0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmd);
  return;
}

Assistant:

void cmGlobalNinjaGenerator::AddMacOSXContentRule()
{
  cmLocalGenerator* lg = this->LocalGenerators[0];

  std::ostringstream cmd;
  cmd << lg->ConvertToOutputFormat(cmSystemTools::GetCMakeCommand(),
                                   cmOutputConverter::SHELL)
      << " -E copy $in $out";

  this->AddRule("COPY_OSX_CONTENT", cmd.str(), "Copying OS X Content $out",
                "Rule for copying OS X bundle content file.",
                /*depfile*/ "",
                /*deptype*/ "",
                /*rspfile*/ "",
                /*rspcontent*/ "",
                /*restat*/ "",
                /*generator*/ false);
}